

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator=(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *rhs)

{
  int **p;
  int *piVar1;
  uint *puVar2;
  uint *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  pointer pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  pointer pnVar14;
  long lVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (this != rhs) {
    clear(this);
    (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(rhs->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar11 = (rhs->super_IdxSet).len;
    (this->super_IdxSet).len = iVar11;
    p = &(this->super_IdxSet).idx;
    spx_realloc<int*>(p,iVar11);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)((ulong)((long)(rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(rhs->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,true)
    ;
    if (rhs->setupStatus == true) {
      IdxSet::operator=(&this->super_IdxSet,&rhs->super_IdxSet);
      lVar12 = (long)(this->super_IdxSet).num;
      if (0 < lVar12) {
        uVar13 = lVar12 + 1;
        do {
          iVar11 = (*p)[uVar13 - 2];
          pnVar14 = (rhs->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar6 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar6[iVar11].m_backend.data + 0x20) =
               *(undefined8 *)((long)&pnVar14[iVar11].m_backend.data + 0x20);
          uVar7 = *(undefined8 *)&pnVar14[iVar11].m_backend.data;
          uVar8 = *(undefined8 *)((long)&pnVar14[iVar11].m_backend.data + 8);
          puVar2 = (uint *)((long)&pnVar14[iVar11].m_backend.data + 0x10);
          uVar9 = *(undefined8 *)(puVar2 + 2);
          puVar3 = (uint *)((long)&pnVar6[iVar11].m_backend.data + 0x10);
          *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
          *(undefined8 *)(puVar3 + 2) = uVar9;
          *(undefined8 *)&pnVar6[iVar11].m_backend.data = uVar7;
          *(undefined8 *)((long)&pnVar6[iVar11].m_backend.data + 8) = uVar8;
          pnVar6[iVar11].m_backend.exp = pnVar14[iVar11].m_backend.exp;
          pnVar6[iVar11].m_backend.neg = pnVar14[iVar11].m_backend.neg;
          iVar10 = pnVar14[iVar11].m_backend.prec_elem;
          pnVar6[iVar11].m_backend.fpclass = pnVar14[iVar11].m_backend.fpclass;
          pnVar6[iVar11].m_backend.prec_elem = iVar10;
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
      }
    }
    else {
      (this->super_IdxSet).num = 0;
      pnVar14 = (rhs->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(rhs->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar14) >> 3)
              * -0x49249249) {
        lVar15 = 0x30;
        lVar12 = 0;
        do {
          local_a8.exp = *(int *)((long)&(pnVar14->m_backend).data + lVar15 + -8);
          local_a8.neg = *(bool *)((long)&(pnVar14->m_backend).data + lVar15 + -4);
          local_a8._48_8_ = *(undefined8 *)((long)&(pnVar14->m_backend).data + lVar15);
          puVar2 = (uint *)((long)&(pnVar14->m_backend).data + lVar15 + -0x30);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&(pnVar14->m_backend).data + lVar15 + -0x20);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_a8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pnVar14->m_backend).data + lVar15 + -0x10);
          if ((local_a8.neg == true) &&
             (local_a8.fpclass != cpp_dec_float_finite || local_a8.data._M_elems[0] != 0)) {
            local_a8.neg = false;
          }
          getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,this);
          if (((local_a8.fpclass != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN))
             && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_a8,&local_68), 0 < iVar11)) {
            pnVar14 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar6 = (this->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar15 + -0x10) =
                 *(undefined8 *)((long)&(pnVar14->m_backend).data + lVar15 + -0x10);
            puVar4 = (undefined8 *)((long)&(pnVar14->m_backend).data + lVar15 + -0x30);
            uVar7 = *puVar4;
            uVar8 = puVar4[1];
            puVar4 = (undefined8 *)((long)&(pnVar14->m_backend).data + lVar15 + -0x20);
            uVar9 = puVar4[1];
            puVar5 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar15 + -0x20);
            *puVar5 = *puVar4;
            puVar5[1] = uVar9;
            puVar4 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar15 + -0x30);
            *puVar4 = uVar7;
            puVar4[1] = uVar8;
            *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar15 + -8) =
                 *(undefined4 *)((long)&(pnVar14->m_backend).data + lVar15 + -8);
            *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar15 + -4) =
                 *(undefined1 *)((long)&(pnVar14->m_backend).data + lVar15 + -4);
            *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar15) =
                 *(undefined8 *)((long)&(pnVar14->m_backend).data + lVar15);
            (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)lVar12;
            piVar1 = &(this->super_IdxSet).num;
            *piVar1 = *piVar1 + 1;
          }
          lVar12 = lVar12 + 1;
          pnVar14 = (rhs->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 0x38;
        } while (lVar12 < (int)((ulong)((long)(rhs->
                                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pnVar14) >> 3) * -0x49249249);
      }
    }
    this->setupStatus = true;
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator=(const SSVectorBase<R>& rhs)
   {
      assert(rhs.isConsistent());

      if(this != &rhs)
      {
         clear();
         _tolerances = rhs._tolerances;
         setMax(rhs.max());
         VectorBase<R>::reDim(rhs.dim());

         if(rhs.isSetup())
         {
            IdxSet::operator=(rhs);

            for(int i = size() - 1; i >= 0; --i)
            {
               int j = index(i);
               VectorBase<R>::val[j] = rhs.val[j];
            }
         }
         else
         {
            num = 0;

            for(int i = 0; i < rhs.dim(); ++i)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  VectorBase<R>::val[i] = rhs.val[i];
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;
      }

      assert(isConsistent());

      return *this;
   }